

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m2v_copy_submat(m2v *A,int A_row_offs,int A_col_offs,int n_row,int n_col,m2v *At,
                    int At_row_offs,int At_col_offs)

{
  m2v_base *pmVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  
  if (0 < n_row) {
    iVar4 = 0;
    do {
      if (0 < n_col) {
        pmVar1 = A->e;
        iVar3 = At_col_offs;
        uVar7 = A_col_offs;
        iVar8 = n_col;
        do {
          uVar6 = uVar7 + 0x1f;
          if (-1 < (int)uVar7) {
            uVar6 = uVar7;
          }
          iVar2 = iVar3 + 0x1f;
          if (-1 < iVar3) {
            iVar2 = iVar3;
          }
          iVar2 = (iVar2 >> 5) + At->row_stride * (iVar4 + At_row_offs);
          uVar5 = 1 << ((byte)iVar3 & 0x1f);
          if ((pmVar1[((int)uVar6 >> 5) + A->row_stride * (iVar4 + A_row_offs)] >> (uVar7 & 0x1f) &
              1) == 0) {
            At->e[iVar2] = At->e[iVar2] & ~uVar5;
          }
          else {
            At->e[iVar2] = At->e[iVar2] | uVar5;
          }
          uVar7 = uVar7 + 1;
          iVar3 = iVar3 + 1;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != n_row);
  }
  return;
}

Assistant:

void MV_GEN_N(_copy_submat)(const MV_GEN_TYPE* A,
				int A_row_offs,
				int A_col_offs,
				int n_row,
				int n_col,
				MV_GEN_TYPE* At,
				int At_row_offs,
				int At_col_offs)
{
	assert(0 <= n_row);
	assert(0 <= n_col);

	assert(0 <= A_row_offs);
	assert(0 <= A_col_offs);
	assert(A_row_offs + n_row <= A->n_row);
	assert(A_col_offs + n_col <= A->n_col);

	assert(0 <= At_row_offs);
	assert(0 <= At_col_offs);
	assert(At_row_offs + n_row <= At->n_row);
	assert(At_col_offs + n_col <= At->n_col);

	for (int r = 0; r < n_row; ++r) {
		for (int c = 0; c < n_col; ++c) {
			MV_GEN_N(_set_el)(At,
			  r + At_row_offs,
			  c + At_col_offs,
			  MV_GEN_N(_get_el)(A, r + A_row_offs, c + A_col_offs));
		}
	}
}